

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.h
# Opt level: O2

void __thiscall GrcSymbolTable::GrcSymbolTable(GrcSymbolTable *this,bool fMain)

{
  _Rb_tree_header *p_Var1;
  undefined3 in_register_00000031;
  
  this->m_psymParent = (Symbol)0x0;
  p_Var1 = &(this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_hmstasymEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_cLevel = 0;
  this->m_csymAnonClass = 0;
  if (CONCAT31(in_register_00000031,fMain) != 0) {
    InitWithPreDefined(this);
  }
  return;
}

Assistant:

GrcSymbolTable(bool fMain)
		:	m_psymParent(NULL),
			m_cLevel(0),
			m_csymAnonClass(0)
	{
		if (fMain)
			InitWithPreDefined();

		//m_staLabelDbg.Assign(""); // DEBUG
	}